

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::array<char,2ul>>::emplaceRealloc<std::array<char,2ul>const&>
          (SmallVectorBase<std::array<char,_2UL>_> *this,pointer pos,array<char,_2UL> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator paVar4;
  long lVar5;
  pointer paVar6;
  EVP_PKEY_CTX *ctx;
  undefined2 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<std::array<char,_2UL>_> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  array<char,_2UL> *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::array<char,_2UL>_>::max_size
                    ((SmallVectorBase<std::array<char,_2UL>_> *)0x458dfb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::array<char,_2UL>_>::calculateGrowth(in_RDI,in_stack_ffffffffffffffb0)
  ;
  __last = in_RSI;
  paVar4 = SmallVectorBase<std::array<char,_2UL>_>::begin(in_RDI);
  lVar5 = (long)__last - (long)paVar4;
  paVar6 = (pointer)operator_new(0x458e58);
  *(undefined2 *)paVar6[lVar5 >> 1]._M_elems = *in_RDX;
  paVar4 = SmallVectorBase<std::array<char,_2UL>_>::end(in_RDI);
  if (in_RSI == paVar4) {
    paVar4 = SmallVectorBase<std::array<char,_2UL>_>::begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<std::array<char,_2UL>_>::end(in_RDI);
    std::uninitialized_move<std::array<char,2ul>*,std::array<char,2ul>*>(in_RSI,__last,paVar4);
  }
  else {
    SmallVectorBase<std::array<char,_2UL>_>::begin(in_RDI);
    std::uninitialized_move<std::array<char,2ul>*,std::array<char,2ul>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<std::array<char,_2UL>_>::end(in_RDI);
    std::uninitialized_move<std::array<char,2ul>*,std::array<char,2ul>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<std::array<char,_2UL>_>::cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = paVar6;
  return paVar6 + (lVar5 >> 1);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}